

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

Expression * slang::ast::IntegerLiteral::fromConstant(Compilation *compilation,SVInt *value)

{
  Type *this;
  IntegerLiteral *pIVar1;
  BumpAllocator *in_RSI;
  Compilation *in_RDI;
  SVInt val;
  undefined8 in_stack_ffffffffffffffc0;
  SourceRange *args_4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SVInt *in_stack_ffffffffffffffd8;
  SourceLocation in_stack_ffffffffffffffe0;
  SourceLocation in_stack_ffffffffffffffe8;
  
  args_4 = (SourceRange *)&stack0xffffffffffffffe0;
  SVInt::resize((SVInt *)args_4,(bitwidth_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  SVInt::setSigned((SVInt *)args_4,true);
  this = Compilation::getIntType(in_RDI);
  pIVar1 = BumpAllocator::
           emplace<slang::ast::IntegerLiteral,slang::ast::Compilation&,slang::ast::Type_const&,slang::SVInt,bool,slang::SourceRange_const&>
                     (in_RSI,(Compilation *)in_stack_ffffffffffffffe8,
                      (Type *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                      (bool *)CONCAT44(in_stack_ffffffffffffffd4,
                                       CONCAT13(1,(int3)in_stack_ffffffffffffffd0)),args_4);
  SVInt::~SVInt((SVInt *)this);
  return &pIVar1->super_Expression;
}

Assistant:

Expression& IntegerLiteral::fromConstant(Compilation& compilation, const SVInt& value) {
    SVInt val = value.resize(32);
    val.setSigned(true);

    return *compilation.emplace<IntegerLiteral>(compilation, compilation.getIntType(),
                                                std::move(val), true, SourceRange::NoLocation);
}